

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O1

bool __thiscall jbcoin::Serializer::getVLLength(Serializer *this,int *length,int offset)

{
  ulong uVar1;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  uint b1;
  ulong uVar5;
  
  uVar5 = (ulong)offset;
  puVar2 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= uVar5) {
    return false;
  }
  uVar1 = uVar5 + 1;
  b1 = (uint)puVar2[uVar5];
  iVar3 = decodeLengthLength(b1);
  if (iVar3 == 2) {
    puVar2 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) <= uVar1) {
      return false;
    }
    iVar3 = decodeVLLength(b1,(uint)puVar2[uVar1]);
  }
  else {
    if (iVar3 == 1) {
      decodeVLLength(b1);
      *length = b1;
      return true;
    }
    puVar2 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar4 = (long)(this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (uVar4 <= uVar1) {
      return false;
    }
    if (uVar4 <= uVar5 + 2) {
      return false;
    }
    iVar3 = decodeVLLength(b1,(uint)puVar2[uVar1],(uint)puVar2[uVar5 + 2]);
  }
  *length = iVar3;
  return true;
}

Assistant:

bool Serializer::getVLLength (int& length, int offset) const
{
    int b1;

    if (!get8 (b1, offset++)) return false;

    int lenLen = decodeLengthLength (b1);

    try
    {
        if (lenLen == 1)
            length = decodeVLLength (b1);
        else if (lenLen == 2)
        {
            int b2;

            if (!get8 (b2, offset++)) return false;

            length = decodeVLLength (b1, b2);
        }
        else if (lenLen == 3)
        {
            int b2, b3;

            if (!get8 (b2, offset++)) return false;

            if (!get8 (b3, offset++)) return false;

            length = decodeVLLength (b1, b2, b3);
        }
        else return false;
    }
    catch (std::exception const&)
    {
        return false;
    }

    return true;
}